

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Izhikevich.cpp
# Opt level: O0

void __thiscall
Izhikevich::Izhikevich(Izhikevich *this,long n_populationID,int n_neuronID,Izhikevich_param *param)

{
  Logging *in_RCX;
  int in_EDX;
  long in_RSI;
  Neuron *in_RDI;
  Neuron *in_stack_ffffffffffffffd0;
  
  Neuron::Neuron(in_RDI);
  in_RDI->_vptr_Neuron = (_func_int **)&PTR_update_0018fa60;
  in_RDI[2]._vptr_Neuron = (_func_int **)0x0;
  in_RDI[2].populationID = 0;
  in_RDI[2].logger = in_RCX;
  in_RDI->populationID = in_RSI;
  in_RDI->neuronID = in_EDX;
  in_RDI[1].populationID =
       (long)(in_RCX->value_populationID).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  in_RDI[1]._vptr_Neuron = (_func_int **)0x0;
  Neuron::initialize(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

Izhikevich::Izhikevich(long n_populationID, int n_neuronID, Izhikevich_param* param) : param(param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    v = param->c;
    u = 0.0;
    initialize();
}